

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

Test * __thiscall
testing::internal::
ParameterizedTestFactory<(anonymous_namespace)::MinMaxTest_CompareReferenceAndVaryStride_Test>::
CreateTest(ParameterizedTestFactory<(anonymous_namespace)::MinMaxTest_CompareReferenceAndVaryStride_Test>
           *this)

{
  Test *this_00;
  long in_RDI;
  
  WithParamInterface<void_(*)(const_unsigned_char_*,_int,_const_unsigned_char_*,_int,_int_*,_int_*)>
  ::SetParam((ParamType *)(in_RDI + 8));
  this_00 = (Test *)operator_new(0x28);
  anon_unknown.dwarf_13161f6::MinMaxTest_CompareReferenceAndVaryStride_Test::
  MinMaxTest_CompareReferenceAndVaryStride_Test
            ((MinMaxTest_CompareReferenceAndVaryStride_Test *)this_00);
  return this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }